

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O3

void Unit_Test::generateOffset(Image *image,uint32_t *x,uint32_t *y,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  
  uVar2 = 0;
  uVar1 = 0;
  uVar3 = image->_width - width;
  if (uVar3 != 0) {
    uVar1 = rand();
    uVar1 = uVar1 % uVar3;
  }
  *x = uVar1;
  uVar1 = image->_height - height;
  if (uVar1 != 0) {
    uVar3 = rand();
    uVar2 = uVar3 % uVar1;
  }
  *y = uVar2;
  return;
}

Assistant:

void generateOffset( const PenguinV_Image::Image & image, uint32_t & x, uint32_t & y, uint32_t width, uint32_t height )
    {
        x = randomValue<uint32_t>( image.width()  - width );
        y = randomValue<uint32_t>( image.height() - height );
    }